

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

char * map_next_(map_base_t *m,map_iter_t *iter)

{
  map_node_t *pmVar1;
  uint uVar2;
  map_iter_t *iter_local;
  map_base_t *m_local;
  
  if (iter->node == (map_node_t *)0x0) goto LAB_0014289e;
  iter->node = iter->node->next;
  pmVar1 = iter->node;
  while( true ) {
    if (pmVar1 != (map_node_t *)0x0) {
      return (char *)(iter->node + 1);
    }
LAB_0014289e:
    uVar2 = iter->bucketidx + 1;
    iter->bucketidx = uVar2;
    if (m->nbuckets <= uVar2) break;
    iter->node = m->buckets[iter->bucketidx];
    pmVar1 = iter->node;
  }
  return (char *)0x0;
}

Assistant:

const char *map_next_(map_base_t *m, map_iter_t *iter) {
  if (iter->node) {
    iter->node = iter->node->next;
    if (iter->node == NULL) goto nextBucket;
  } else {
    nextBucket:
    do {
      if (++iter->bucketidx >= m->nbuckets) {
        return NULL;
      }
      iter->node = m->buckets[iter->bucketidx];
    } while (iter->node == NULL);
  }
  return (char*) (iter->node + 1);
}